

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<double,1,0>::accumulateDerivativesImpl<true,true,true>
          (BeagleCPUImpl<double,1,0> *this,double *outDerivatives,double *outSumDerivatives,
          double *outSumSquaredDerivatives)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  uVar1 = *(uint *)(this + 0x14);
  lVar2 = *(long *)(this + 0x100);
  lVar3 = *(long *)(this + 0xf8);
  lVar4 = *(long *)(this + 0x80);
  auVar6 = ZEXT816(0) << 0x40;
  auVar7 = ZEXT816(0) << 0x40;
  uVar5 = 0;
  while ((~((int)uVar1 >> 0x1f) & uVar1) != uVar5) {
    auVar8._0_8_ = *(double *)(lVar2 + uVar5 * 8) / *(double *)(lVar3 + uVar5 * 8);
    auVar8._8_8_ = 0;
    outDerivatives[uVar5] = auVar8._0_8_;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = *(ulong *)(lVar4 + uVar5 * 8);
    uVar5 = uVar5 + 1;
    auVar7 = vfmadd231sd_fma(auVar7,auVar8,auVar10);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = auVar8._0_8_ * auVar8._0_8_;
    auVar6 = vfmadd231sd_fma(auVar6,auVar10,auVar9);
  }
  *outSumDerivatives = auVar7._0_8_;
  *outSumSquaredDerivatives = auVar6._0_8_;
  return;
}

Assistant:

void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::accumulateDerivativesImpl(
        double* outDerivatives,
        double* outSumDerivatives,
        double* outSumSquaredDerivatives) {

    REALTYPE sum = 0.0;
    REALTYPE sumSquared = 0.0;

    for (int k = 0; k < kPatternCount; k++) {
        REALTYPE derivative = grandNumeratorDerivTmp[k] / grandDenominatorDerivTmp[k];
        if (DoDerivatives) {
            outDerivatives[k] = derivative;
        }
        if (DoSum) { // TODO Confirm that these are compile-time
            sum += derivative * gPatternWeights[k];
        }
        if (DoSumSquared) {
            sumSquared += derivative * derivative * gPatternWeights[k];
        }
    }

    if (DoSum) {
        *outSumDerivatives = sum;
    }

    if (DoSumSquared) {
        *outSumSquaredDerivatives = sumSquared;
    }
}